

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

UChar32 utf16BEIteratorPrevious(UCharIterator *iter)

{
  int index_00;
  int32_t index;
  UCharIterator *iter_local;
  
  if (iter->start < iter->index) {
    index_00 = iter->index + -1;
    iter->index = index_00;
    iter_local._4_4_ = utf16BEIteratorGet(iter,index_00);
  }
  else {
    iter_local._4_4_ = -1;
  }
  return iter_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
utf16BEIteratorPrevious(UCharIterator *iter) {
    int32_t index;

    if((index=iter->index)>iter->start) {
        iter->index=--index;
        return utf16BEIteratorGet(iter, index);
    } else {
        return U_SENTINEL;
    }
}